

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSampleShadingTests.cpp
# Opt level: O0

int __thiscall
glcts::SampleShadingRenderCase::countUniquePixels
          (SampleShadingRenderCase *this,ConstPixelBufferAccess *pixels)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  int local_60;
  int x;
  int local_4c;
  undefined1 local_48 [4];
  int y;
  set<tcu::Vector<float,_4>,_std::less<tcu::Vector<float,_4>_>,_std::allocator<tcu::Vector<float,_4>_>_>
  uniquePixels;
  ConstPixelBufferAccess *pixels_local;
  SampleShadingRenderCase *this_local;
  
  uniquePixels._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pixels;
  std::
  set<tcu::Vector<float,_4>,_std::less<tcu::Vector<float,_4>_>,_std::allocator<tcu::Vector<float,_4>_>_>
  ::set((set<tcu::Vector<float,_4>,_std::less<tcu::Vector<float,_4>_>,_std::allocator<tcu::Vector<float,_4>_>_>
         *)local_48);
  local_4c = 0;
  while( true ) {
    iVar1 = local_4c;
    iVar2 = tcu::ConstPixelBufferAccess::getHeight
                      ((ConstPixelBufferAccess *)
                       uniquePixels._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (iVar2 <= iVar1) break;
    local_60 = 0;
    while( true ) {
      iVar1 = local_60;
      iVar2 = tcu::ConstPixelBufferAccess::getWidth
                        ((ConstPixelBufferAccess *)
                         uniquePixels._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (iVar2 <= iVar1) break;
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)&stack0xffffffffffffff90,
                 (int)uniquePixels._M_t._M_impl.super__Rb_tree_header._M_node_count,local_60,
                 local_4c);
      std::
      set<tcu::Vector<float,_4>,_std::less<tcu::Vector<float,_4>_>,_std::allocator<tcu::Vector<float,_4>_>_>
      ::insert((set<tcu::Vector<float,_4>,_std::less<tcu::Vector<float,_4>_>,_std::allocator<tcu::Vector<float,_4>_>_>
                *)local_48,(value_type *)&stack0xffffffffffffff90);
      local_60 = local_60 + 1;
    }
    local_4c = local_4c + 1;
  }
  sVar3 = std::
          set<tcu::Vector<float,_4>,_std::less<tcu::Vector<float,_4>_>,_std::allocator<tcu::Vector<float,_4>_>_>
          ::size((set<tcu::Vector<float,_4>,_std::less<tcu::Vector<float,_4>_>,_std::allocator<tcu::Vector<float,_4>_>_>
                  *)local_48);
  std::
  set<tcu::Vector<float,_4>,_std::less<tcu::Vector<float,_4>_>,_std::allocator<tcu::Vector<float,_4>_>_>
  ::~set((set<tcu::Vector<float,_4>,_std::less<tcu::Vector<float,_4>_>,_std::allocator<tcu::Vector<float,_4>_>_>
          *)local_48);
  return (int)sVar3;
}

Assistant:

int SampleShadingRenderCase::countUniquePixels(tcu::ConstPixelBufferAccess const& pixels)
{
	std::set<tcu::Vec4> uniquePixels;

	for (int y = 0; y < pixels.getHeight(); ++y)
	{
		for (int x = 0; x < pixels.getWidth(); ++x)
		{
			uniquePixels.insert(pixels.getPixel(x, y));
		}
	}

	return (int)uniquePixels.size();
}